

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

bool __thiscall cmsys::Directory::FileIsSymlink(Directory *this,size_t i)

{
  bool bVar1;
  string local_40;
  string *local_20;
  string *path;
  size_t i_local;
  Directory *this_local;
  
  path = (string *)i;
  i_local = (size_t)this;
  GetFilePath_abi_cxx11_(&local_40,this,i);
  local_20 = &local_40;
  bVar1 = SystemTools::FileIsSymlink(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool Directory::FileIsSymlink(std::size_t i) const
{
  std::string const& path = this->GetFilePath(i);
#if defined(_WIN32) && !defined(__CYGWIN__)
  auto const& data = this->Internal->Files[i].FindData;
  return kwsys::SystemTools::FileIsSymlinkWithAttr(
    Encoding::ToWindowsExtendedPath(path), data.dwFileAttributes);
#else
  return kwsys::SystemTools::FileIsSymlink(path);
#endif
}